

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::string_maker<bool>::to_string_abi_cxx11_(bool *value)

{
  void *this;
  byte *in_RSI;
  string *in_RDI;
  ostringstream os;
  ostringstream local_188 [376];
  byte *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  this = (void *)std::ostream::operator<<(local_188,std::boolalpha);
  std::ostream::operator<<(this,(bool)(*local_10 & 1));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }